

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_blob_detection.cpp
# Opt level: O1

bool blob_detection::Detect1Blob(void)

{
  uint32_t y;
  uint8_t value;
  uint32_t uVar1;
  int iVar2;
  vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *pvVar3;
  size_t sVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  BlobDetection detection;
  Image image;
  uint32_t local_130;
  uint32_t local_12c;
  uint32_t local_128;
  uint32_t local_124;
  uint32_t local_120;
  uint32_t local_11c;
  undefined1 local_118 [16];
  pointer local_108;
  Image local_f0;
  undefined1 local_c8 [64];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uVar1 = Test_Helper::runCount();
  bVar8 = uVar1 == 0;
  if (!bVar8) {
    uVar6 = 0;
    do {
      PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
                ((ImageTemplate<unsigned_char> *)local_118,0,0,'\x01','\x01');
      Unit_Test::blackImage(&local_f0,(ImageTemplate<unsigned_char> *)local_118);
      local_118._0_8_ = &PTR__ImageTemplate_00219948;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)local_118)
      ;
      Unit_Test::generateRoi(&local_f0,&local_11c,&local_120,&local_12c,&local_130);
      y = local_120;
      uVar1 = local_130;
      local_124 = local_11c;
      local_128 = local_12c;
      iVar2 = rand();
      value = (uint8_t)iVar2;
      if (value == '\0') {
        value = '\x01';
      }
      Unit_Test::fillImage(&local_f0,local_124,y,local_128,uVar1,value);
      local_118._0_8_ = (pointer)0x0;
      local_118._8_8_ = (pointer)0x0;
      local_108 = (pointer)0x0;
      local_c8 = ZEXT464(0) << 0x40;
      local_88 = 0;
      uStack_80 = 0;
      uStack_68 = 0;
      uStack_60 = 0;
      uStack_58 = 0;
      uStack_50 = 0;
      uStack_48 = 0;
      uStack_40 = 0;
      uStack_78 = local_88;
      uStack_70 = uStack_80;
      Blob_Detection::BlobDetection::find
                ((BlobDetection *)local_118,&local_f0,(BlobParameters)ZEXT72144(ZEXT872(0) << 0x40),
                 '\x01');
      uVar7 = (local_130 + local_12c) * 2 - 4;
      if (local_130 < 3) {
        uVar7 = local_130 * local_12c;
      }
      if (local_12c < 2) {
        uVar7 = local_130 * local_12c;
      }
      pvVar3 = Blob_Detection::BlobDetection::operator()((BlobDetection *)local_118);
      if ((long)(pvVar3->
                super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(pvVar3->
                super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
                )._M_impl.super__Vector_impl_data._M_start != 0x100) {
LAB_00136807:
        std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::~vector
                  ((vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
                   local_118);
        local_f0._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
        PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_f0);
        return bVar8;
      }
      pvVar3 = Blob_Detection::BlobDetection::operator()((BlobDetection *)local_118);
      uVar1 = Blob_Detection::BlobInfo::width
                        ((pvVar3->
                         super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
                         )._M_impl.super__Vector_impl_data._M_start);
      if (uVar1 != local_12c) goto LAB_00136807;
      pvVar3 = Blob_Detection::BlobDetection::operator()((BlobDetection *)local_118);
      uVar1 = Blob_Detection::BlobInfo::height
                        ((pvVar3->
                         super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
                         )._M_impl.super__Vector_impl_data._M_start);
      if (uVar1 != local_130) goto LAB_00136807;
      pvVar3 = Blob_Detection::BlobDetection::operator()((BlobDetection *)local_118);
      sVar4 = Blob_Detection::BlobInfo::size
                        ((pvVar3->
                         super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
                         )._M_impl.super__Vector_impl_data._M_start);
      if (sVar4 != local_130 * local_12c) goto LAB_00136807;
      pvVar3 = Blob_Detection::BlobDetection::operator()((BlobDetection *)local_118);
      pvVar5 = Blob_Detection::BlobInfo::contourX
                         ((pvVar3->
                          super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
                          )._M_impl.super__Vector_impl_data._M_start);
      if ((long)(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2 != (ulong)uVar7) goto LAB_00136807;
      pvVar3 = Blob_Detection::BlobDetection::operator()((BlobDetection *)local_118);
      pvVar5 = Blob_Detection::BlobInfo::edgeX
                         ((pvVar3->
                          super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>
                          )._M_impl.super__Vector_impl_data._M_start);
      if ((long)(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2 != (ulong)uVar7) goto LAB_00136807;
      std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::~vector
                ((vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *)
                 local_118);
      local_f0._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_f0);
      uVar6 = uVar6 + 1;
      uVar1 = Test_Helper::runCount();
      bVar8 = uVar6 >= uVar1;
    } while (uVar6 < uVar1);
  }
  return bVar8;
}

Assistant:

bool Detect1Blob()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            PenguinV_Image::Image image = Unit_Test::blackImage();

            uint32_t roiX, roiY;
            uint32_t roiWidth, roiHeight;
            Unit_Test::generateRoi( image, roiX, roiY, roiWidth, roiHeight );

            Unit_Test::fillImage( image, roiX, roiY, roiWidth, roiHeight, Unit_Test::randomValue<uint8_t>( 1, 256 ) );

            Blob_Detection::BlobDetection detection;
            detection.find( image );

            const uint32_t contour = ((roiWidth > 1) && (roiHeight > 2)) ? (2 * roiWidth + 2 * (roiHeight - 2)) : (roiWidth * roiHeight);

            if( detection().size() != 1 || detection()[0].width() != roiWidth ||
                detection()[0].height() != roiHeight || detection()[0].size() != roiWidth * roiHeight ||
                detection()[0].contourX().size() != contour ||
                detection()[0].edgeX   ().size() != contour )
                return false;
        }

        return true;
    }